

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall
duckdb::Vector::FindResizeInfos
          (Vector *this,vector<duckdb::ResizeInfo,_true> *resize_infos,idx_t multiplier)

{
  data_ptr_t data;
  VectorBufferType VVar1;
  bool bVar2;
  VectorBuffer *pVVar3;
  VectorArrayBuffer *this_00;
  vector<duckdb::ResizeInfo,_true> *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  Vector *child_2;
  idx_t new_multiplier;
  VectorArrayBuffer *vector_array_buffer;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_1;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *children;
  VectorStructBuffer *vector_struct_buffer;
  Vector *child;
  VectorListBuffer *vector_list_buffer;
  ResizeInfo resize_info;
  Vector *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  ResizeInfo *in_stack_ffffffffffffff28;
  vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_> *in_stack_ffffffffffffff30;
  __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  local_90;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_88;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_80;
  VectorStructBuffer *local_78;
  Vector *local_70;
  VectorListBuffer *local_68;
  optional_ptr<duckdb::VectorBuffer,_true> local_40 [4];
  idx_t in_stack_ffffffffffffffe0;
  
  data = in_RDI->data;
  pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::get
                     ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcc0de);
  optional_ptr<duckdb::VectorBuffer,_true>::optional_ptr(local_40,pVVar3);
  ResizeInfo::ResizeInfo((ResizeInfo *)(local_40 + 1),in_RDI,data,local_40[0],(idx_t)in_RDX);
  ::std::vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>::
  emplace_back<duckdb::ResizeInfo_&>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (in_RDI->data == (data_ptr_t)0x0) {
    GetAuxiliary(in_stack_ffffffffffffff18);
    pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)
                        CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    VVar1 = VectorBuffer::GetBufferType(pVVar3);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcc180);
    if (VVar1 == STRUCT_BUFFER) {
      shared_ptr<duckdb::VectorBuffer,_true>::operator->
                ((shared_ptr<duckdb::VectorBuffer,_true> *)CONCAT17(5,in_stack_ffffffffffffff20));
      local_78 = VectorBuffer::Cast<duckdb::VectorStructBuffer>
                           ((VectorBuffer *)CONCAT17(VVar1,in_stack_ffffffffffffff20));
      local_88 = VectorStructBuffer::GetChildren(local_78);
      local_80 = local_88;
      local_90._M_current =
           (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                    *)in_stack_ffffffffffffff18);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ::end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             *)in_stack_ffffffffffffff18);
      while (bVar2 = __gnu_cxx::
                     operator!=<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)CONCAT17(VVar1,in_stack_ffffffffffffff20),
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_ffffffffffffff18), bVar2) {
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator*(&local_90);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   CONCAT17(VVar1,in_stack_ffffffffffffff20));
        FindResizeInfos(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator++(&local_90);
      }
    }
    else if (VVar1 == LIST_BUFFER) {
      shared_ptr<duckdb::VectorBuffer,_true>::operator->
                ((shared_ptr<duckdb::VectorBuffer,_true> *)CONCAT17(6,in_stack_ffffffffffffff20));
      local_68 = VectorBuffer::Cast<duckdb::VectorListBuffer>
                           ((VectorBuffer *)CONCAT17(VVar1,in_stack_ffffffffffffff20));
      local_70 = VectorListBuffer::GetChild((VectorListBuffer *)0x2bcc1fa);
      FindResizeInfos(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    }
    else if (VVar1 == ARRAY_BUFFER) {
      shared_ptr<duckdb::VectorBuffer,_true>::operator->
                ((shared_ptr<duckdb::VectorBuffer,_true> *)CONCAT17(9,in_stack_ffffffffffffff20));
      this_00 = VectorBuffer::Cast<duckdb::VectorArrayBuffer>
                          ((VectorBuffer *)CONCAT17(VVar1,in_stack_ffffffffffffff20));
      VectorArrayBuffer::GetArraySize(this_00);
      VectorArrayBuffer::GetChild((VectorArrayBuffer *)0x2bcc301);
      FindResizeInfos(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void Vector::FindResizeInfos(vector<ResizeInfo> &resize_infos, const idx_t multiplier) {

	ResizeInfo resize_info(*this, data, buffer.get(), multiplier);
	resize_infos.emplace_back(resize_info);

	// Base case.
	if (data) {
		return;
	}

	D_ASSERT(auxiliary);
	switch (GetAuxiliary()->GetBufferType()) {
	case VectorBufferType::LIST_BUFFER: {
		auto &vector_list_buffer = auxiliary->Cast<VectorListBuffer>();
		auto &child = vector_list_buffer.GetChild();
		child.FindResizeInfos(resize_infos, multiplier);
		break;
	}
	case VectorBufferType::STRUCT_BUFFER: {
		auto &vector_struct_buffer = auxiliary->Cast<VectorStructBuffer>();
		auto &children = vector_struct_buffer.GetChildren();
		for (auto &child : children) {
			child->FindResizeInfos(resize_infos, multiplier);
		}
		break;
	}
	case VectorBufferType::ARRAY_BUFFER: {
		// We need to multiply the multiplier by the array size because
		// the child vectors of ARRAY types are always child_count * array_size.
		auto &vector_array_buffer = auxiliary->Cast<VectorArrayBuffer>();
		auto new_multiplier = vector_array_buffer.GetArraySize() * multiplier;
		auto &child = vector_array_buffer.GetChild();
		child.FindResizeInfos(resize_infos, new_multiplier);
		break;
	}
	default:
		break;
	}
}